

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeTreeUpdatePosSize
               (ImGuiDockNode *node,ImVec2 pos,ImVec2 size,bool only_write_to_marked_nodes)

{
  float fVar1;
  ImGuiAxis IVar2;
  ImGuiDockNode *this;
  ImGuiDockNode *this_00;
  ImVec2 pos_00;
  bool bVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  byte local_a1;
  float split_ratio;
  float ratio_0;
  float size_min_each;
  ImGuiContext *g;
  float size_avail;
  ImGuiAxis axis;
  float spacing;
  ImVec2 child_1_size;
  ImVec2 child_0_size;
  ImVec2 child_1_pos;
  ImVec2 child_0_pos;
  ImGuiDockNode *child_1;
  ImGuiDockNode *child_0;
  bool write_to_node;
  bool only_write_to_marked_nodes_local;
  ImGuiDockNode *node_local;
  ImVec2 size_local;
  ImVec2 pos_local;
  
  local_a1 = 1;
  if (only_write_to_marked_nodes) {
    local_a1 = (byte)node->field_0xba >> 3 & 1;
  }
  if (local_a1 != 0) {
    node->Pos = pos;
    node->Size = size;
  }
  node_local = (ImGuiDockNode *)size;
  size_local = pos;
  bVar3 = ImGuiDockNode::IsLeafNode(node);
  pos_00 = size_local;
  if (bVar3) {
    return;
  }
  this = node->ChildNodes[0];
  this_00 = node->ChildNodes[1];
  child_0_size = size_local;
  child_1_size = (ImVec2)node_local;
  _axis = (ImVec2)node_local;
  if (((*(ushort *)&this->field_0xb8 >> 9 & 1) == 0) ||
     ((*(ushort *)&this_00->field_0xb8 >> 9 & 1) == 0)) goto LAB_0015df28;
  IVar2 = node->SplitAxis;
  pfVar4 = ImVec2::operator[]((ImVec2 *)&node_local,(long)IVar2);
  fVar5 = ImMax<float>(*pfVar4 - 2.0,0.0);
  pfVar4 = ImVec2::operator[](&(GImGui->Style).WindowMinSize,(long)IVar2);
  fVar6 = ImMin<float>(fVar5,*pfVar4 * 2.0);
  fVar6 = ImFloor(fVar6 * 0.5);
  if ((*(short *)&this->field_0xb8 < 0) && (-1 < *(short *)&this_00->field_0xb8)) {
    pfVar4 = ImVec2::operator[](&this->Size,(long)IVar2);
    fVar6 = ImMin<float>(fVar5 - 1.0,*pfVar4);
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    *pfVar4 = fVar6;
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    *pfVar4 = fVar6;
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    fVar6 = *pfVar4;
    pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
    *pfVar4 = fVar5 - fVar6;
    pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
    *pfVar4 = fVar5 - fVar6;
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    bVar3 = false;
    if (0.0 < *pfVar4) {
      pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
      bVar3 = 0.0 < *pfVar4;
    }
    if (!bVar3) {
      __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x36c3,
                    "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)");
    }
  }
  else if ((*(short *)&this_00->field_0xb8 < 0) && (-1 < *(short *)&this->field_0xb8)) {
    pfVar4 = ImVec2::operator[](&this_00->Size,(long)IVar2);
    fVar6 = ImMin<float>(fVar5 - 1.0,*pfVar4);
    pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
    *pfVar4 = fVar6;
    pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
    *pfVar4 = fVar6;
    pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
    fVar6 = *pfVar4;
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    *pfVar4 = fVar5 - fVar6;
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    *pfVar4 = fVar5 - fVar6;
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    bVar3 = false;
    if (0.0 < *pfVar4) {
      pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
      bVar3 = 0.0 < *pfVar4;
    }
    if (!bVar3) {
      __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x36c9,
                    "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)");
    }
  }
  else if ((*(short *)&this->field_0xb8 < 0) && (*(short *)&this_00->field_0xb8 < 0)) {
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    fVar6 = *pfVar4;
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    fVar7 = *pfVar4;
    pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
    fVar6 = ImFloor(fVar5 * (fVar6 / (fVar7 + *pfVar4)));
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    *pfVar4 = fVar6;
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    *pfVar4 = fVar6;
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    fVar6 = *pfVar4;
    pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
    *pfVar4 = fVar5 - fVar6;
    pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
    *pfVar4 = fVar5 - fVar6;
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    bVar3 = false;
    if (0.0 < *pfVar4) {
      pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
      bVar3 = 0.0 < *pfVar4;
    }
    if (!bVar3) {
      __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x36d2,
                    "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)");
    }
  }
  else {
    bVar3 = ImGuiDockNode::IsCentralNode(this_00);
    if (bVar3) {
      pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
      if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
        pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
        fVar6 = ImMin<float>(fVar5 - fVar6,*pfVar4);
        pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
        *pfVar4 = fVar6;
        pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
        fVar6 = *pfVar4;
        pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
        *pfVar4 = fVar5 - fVar6;
        goto LAB_0015deea;
      }
    }
    bVar3 = ImGuiDockNode::IsCentralNode(this);
    if (bVar3) {
      pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
      if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
        pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
        fVar6 = ImMin<float>(fVar5 - fVar6,*pfVar4);
        pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
        *pfVar4 = fVar6;
        pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
        fVar6 = *pfVar4;
        pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
        *pfVar4 = fVar5 - fVar6;
        goto LAB_0015deea;
      }
    }
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    fVar7 = *pfVar4;
    pfVar4 = ImVec2::operator[](&this->SizeRef,(long)IVar2);
    fVar1 = *pfVar4;
    pfVar4 = ImVec2::operator[](&this_00->SizeRef,(long)IVar2);
    fVar7 = ImFloor(fVar5 * (fVar7 / (fVar1 + *pfVar4)) + 0.5);
    fVar6 = ImMax<float>(fVar6,fVar7);
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    *pfVar4 = fVar6;
    pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
    fVar6 = *pfVar4;
    pfVar4 = ImVec2::operator[]((ImVec2 *)&axis,(long)IVar2);
    *pfVar4 = fVar5 - fVar6;
  }
LAB_0015deea:
  pfVar4 = ImVec2::operator[](&child_1_size,(long)IVar2);
  fVar5 = *pfVar4;
  pfVar4 = ImVec2::operator[](&child_0_size,(long)IVar2);
  *pfVar4 = fVar5 + 2.0 + *pfVar4;
LAB_0015df28:
  *(ushort *)&this_00->field_0xb8 = *(ushort *)&this_00->field_0xb8 & 0x7fff;
  *(ushort *)&this->field_0xb8 = *(ushort *)&this->field_0xb8 & 0x7fff;
  if ((*(ushort *)&this->field_0xb8 >> 9 & 1) != 0) {
    DockNodeTreeUpdatePosSize(this,pos_00,child_1_size,false);
  }
  if ((*(ushort *)&this_00->field_0xb8 >> 9 & 1) != 0) {
    DockNodeTreeUpdatePosSize(this_00,child_0_size,_axis,false);
  }
  return;
}

Assistant:

void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode* node, ImVec2 pos, ImVec2 size, bool only_write_to_marked_nodes)
{
    // During the regular dock node update we write to all nodes.
    // 'only_write_to_marked_nodes' is only set when turning a node visible mid-frame and we need its size right-away.
    const bool write_to_node = (only_write_to_marked_nodes == false) || (node->MarkedForPosSizeWrite);
    if (write_to_node)
    {
        node->Pos = pos;
        node->Size = size;
    }

    if (node->IsLeafNode())
        return;

    ImGuiDockNode* child_0 = node->ChildNodes[0];
    ImGuiDockNode* child_1 = node->ChildNodes[1];
    ImVec2 child_0_pos = pos, child_1_pos = pos;
    ImVec2 child_0_size = size, child_1_size = size;
    if (child_0->IsVisible && child_1->IsVisible)
    {
        const float spacing = DOCKING_SPLITTER_SIZE;
        const ImGuiAxis axis = (ImGuiAxis)node->SplitAxis;
        const float size_avail = ImMax(size[axis] - spacing, 0.0f);

        // Size allocation policy
        // 1) The first 0..WindowMinSize[axis]*2 are allocated evenly to both windows.
        ImGuiContext& g = *GImGui;
        const float size_min_each = ImFloor(ImMin(size_avail, g.Style.WindowMinSize[axis] * 2.0f) * 0.5f);

        // 2) Process locked absolute size (during a splitter resize we preserve the child of nodes not touching the splitter edge)
        if (child_0->WantLockSizeOnce && !child_1->WantLockSizeOnce)
        {
            child_0_size[axis] = child_0->SizeRef[axis] = ImMin(size_avail - 1.0f, child_0->Size[axis]);
            child_1_size[axis] = child_1->SizeRef[axis] = (size_avail - child_0_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }
        else if (child_1->WantLockSizeOnce && !child_0->WantLockSizeOnce)
        {
            child_1_size[axis] = child_1->SizeRef[axis] = ImMin(size_avail - 1.0f, child_1->Size[axis]);
            child_0_size[axis] = child_0->SizeRef[axis] = (size_avail - child_1_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }
        else if (child_0->WantLockSizeOnce && child_1->WantLockSizeOnce)
        {
            // FIXME-DOCK: We cannot honor the requested size, so apply ratio.
            // Currently this path will only be taken if code programmatically sets WantLockSizeOnce
            float ratio_0 = child_0_size[axis] / (child_0_size[axis] + child_1_size[axis]);
            child_0_size[axis] = child_0->SizeRef[axis] = ImFloor(size_avail * ratio_0);
            child_1_size[axis] = child_1->SizeRef[axis] = (size_avail - child_0_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }

        // 3) If one window is the central node (~ use remaining space, should be made explicit!), use explicit size from the other, and remainder for the central node
        else if (child_1->IsCentralNode() && child_0->SizeRef[axis] != 0.0f)
        {
            child_0_size[axis] = ImMin(size_avail - size_min_each, child_0->SizeRef[axis]);
            child_1_size[axis] = (size_avail - child_0_size[axis]);
        }
        else if (child_0->IsCentralNode() && child_1->SizeRef[axis] != 0.0f)
        {
            child_1_size[axis] = ImMin(size_avail - size_min_each, child_1->SizeRef[axis]);
            child_0_size[axis] = (size_avail - child_1_size[axis]);
        }
        else
        {
            // 4) Otherwise distribute according to the relative ratio of each SizeRef value
            float split_ratio = child_0->SizeRef[axis] / (child_0->SizeRef[axis] + child_1->SizeRef[axis]);
            child_0_size[axis] = ImMax(size_min_each, ImFloor(size_avail * split_ratio + 0.5F));
            child_1_size[axis] = (size_avail - child_0_size[axis]);
        }

        child_1_pos[axis] += spacing + child_0_size[axis];
    }
    child_0->WantLockSizeOnce = child_1->WantLockSizeOnce = false;

    if (child_0->IsVisible)
        DockNodeTreeUpdatePosSize(child_0, child_0_pos, child_0_size);
    if (child_1->IsVisible)
        DockNodeTreeUpdatePosSize(child_1, child_1_pos, child_1_size);
}